

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O1

void __thiscall
MeshDenoisingViaL0Minimization::getInitialVerticesMatrix
          (MeshDenoisingViaL0Minimization *this,TriMesh *noisy_mesh,
          MatrixXd *initial_vertices_matrix)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  int iVar5;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  reference pvVar6;
  long lVar7;
  long lVar8;
  BaseHandle _idx;
  VertexIter VVar9;
  undefined1 local_40 [8];
  VertexIter v_it;
  
  iVar5 = (**(code **)(*(long *)&(noisy_mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x10))(noisy_mesh);
  lVar8 = (long)iVar5;
  if (lVar8 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)initial_vertices_matrix,lVar8 * 3,lVar8,3);
  _local_40 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)noisy_mesh);
  VVar9 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)noisy_mesh);
  if (v_it.mesh_._0_4_ != (BaseHandle)VVar9.hnd_.super_BaseHandle.idx_ ||
      local_40 != (undefined1  [8])VVar9.mesh_) {
    _idx = v_it.mesh_._0_4_;
    do {
      this_00 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                          ((PropertyContainer *)
                           &(noisy_mesh->super_Mesh).
                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                            .
                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            .field_0x8,
                           (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                           (noisy_mesh->super_Mesh).
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           .points_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                           super_BaseHandle.idx_);
      pvVar6 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](this_00,_idx.idx_);
      if (_idx.idx_ < 0) {
LAB_001623a3:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      lVar7 = (long)_idx.idx_;
      lVar8 = (initial_vertices_matrix->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      if ((lVar8 <= lVar7) ||
         (lVar3 = (initial_vertices_matrix->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
         , lVar3 < 1)) goto LAB_001623a3;
      dVar1 = (pvVar6->super_VectorDataT<double,_3>).values_[1];
      dVar2 = (pvVar6->super_VectorDataT<double,_3>).values_[2];
      pdVar4 = (initial_vertices_matrix->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
      pdVar4[lVar7] = (pvVar6->super_VectorDataT<double,_3>).values_[0];
      if ((lVar3 == 1) || (pdVar4[lVar8 + lVar7] = dVar1, lVar3 < 3)) goto LAB_001623a3;
      pdVar4[lVar8 * 2 + lVar7] = dVar2;
      v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)v_it.mesh_._0_4_ + 1);
      if (v_it.mesh_._4_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    *)local_40);
      }
      VVar9 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)noisy_mesh);
      _idx = v_it.mesh_._0_4_;
    } while (v_it.mesh_._0_4_ != (BaseHandle)VVar9.hnd_.super_BaseHandle.idx_ ||
             local_40 != (undefined1  [8])VVar9.mesh_);
  }
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::getInitialVerticesMatrix(TriMesh &noisy_mesh, Eigen::MatrixXd &initial_vertices_matrix)
{
    initial_vertices_matrix.resize((int)noisy_mesh.n_vertices(), 3);

    for(TriMesh::VertexIter v_it = noisy_mesh.vertices_begin(); v_it != noisy_mesh.vertices_end(); v_it++)
    {
        int index = v_it->idx();
        TriMesh::Point p = noisy_mesh.point(*v_it);
        initial_vertices_matrix(index, 0) = p[0];
        initial_vertices_matrix(index, 1) = p[1];
        initial_vertices_matrix(index, 2) = p[2];
    }
}